

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O2

int StackToolFormatLevelInfo
              (ImGuiIDStackTool *tool,int n,bool format_for_ui,char *buf,size_t buf_size)

{
  ImGuiStackLevelInfo *pIVar1;
  ImGuiStackLevelInfo *pIVar2;
  int iVar3;
  ImGuiWindow *pIVar4;
  char *pcVar5;
  char *fmt;
  
  pIVar2 = (tool->Results).Data;
  pIVar1 = pIVar2 + n;
  if ((n == 0) && (pIVar2[n].Desc[0] == '\0')) {
    pIVar4 = ImGui::FindWindowByID(pIVar1->ID);
    if (pIVar4 != (ImGuiWindow *)0x0) {
      fmt = "%s";
      if (format_for_ui) {
        fmt = "\"%s\" [window]";
      }
      pcVar5 = pIVar4->Name;
      goto LAB_0016e8fa;
    }
  }
  if (pIVar1->QuerySuccess != true) {
    iVar3 = tool->StackLevel;
    if (iVar3 < (tool->Results).Size) {
      *buf = '\0';
      return iVar3;
    }
    iVar3 = ImFormatString(buf,buf_size,"???");
    return iVar3;
  }
  pcVar5 = pIVar2[n].Desc;
  fmt = "\"%s\"";
  if (pIVar1->field_0x6 != '\f') {
    fmt = "%s";
  }
  if (!format_for_ui) {
    fmt = "%s";
  }
LAB_0016e8fa:
  iVar3 = ImFormatString(buf,buf_size,fmt,pcVar5);
  return iVar3;
}

Assistant:

static int StackToolFormatLevelInfo(ImGuiIDStackTool* tool, int n, bool format_for_ui, char* buf, size_t buf_size)
{
    ImGuiStackLevelInfo* info = &tool->Results[n];
    ImGuiWindow* window = (info->Desc[0] == 0 && n == 0) ? ImGui::FindWindowByID(info->ID) : NULL;
    if (window)                                                                 // Source: window name (because the root ID don't call GetID() and so doesn't get hooked)
        return ImFormatString(buf, buf_size, format_for_ui ? "\"%s\" [window]" : "%s", window->Name);
    if (info->QuerySuccess)                                                     // Source: GetID() hooks (prioritize over ItemInfo() because we frequently use patterns like: PushID(str), Button("") where they both have same id)
        return ImFormatString(buf, buf_size, (format_for_ui && info->DataType == ImGuiDataType_String) ? "\"%s\"" : "%s", info->Desc);
    if (tool->StackLevel < tool->Results.Size)                                  // Only start using fallback below when all queries are done, so during queries we don't flickering ??? markers.
        return (*buf = 0);
#ifdef IMGUI_ENABLE_TEST_ENGINE
    if (const char* label = ImGuiTestEngine_FindItemDebugLabel(GImGui, info->ID))   // Source: ImGuiTestEngine's ItemInfo()
        return ImFormatString(buf, buf_size, format_for_ui ? "??? \"%s\"" : "%s", label);
#endif
    return ImFormatString(buf, buf_size, "???");
}